

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

void __thiscall
Graph<unsigned_long,_scc::VectorType>::Node::dual_dfs
          (Node *this,
          vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
          *acc)

{
  pointer ppNVar1;
  pointer ppNVar2;
  Node *local_28;
  
  if (this->visited == false) {
    this->visited = true;
    ppNVar1 = (this->dual_edges).
              super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppNVar2 = (this->dual_edges).
                   super__Vector_base<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppNVar2 != ppNVar1;
        ppNVar2 = ppNVar2 + 1) {
      dual_dfs(*ppNVar2,acc);
    }
    local_28 = this;
    std::
    vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
    ::emplace_back<Graph<unsigned_long,scc::VectorType>::Node_const*>
              ((vector<Graph<unsigned_long,scc::VectorType>::Node_const*,std::allocator<Graph<unsigned_long,scc::VectorType>::Node_const*>>
                *)acc,&local_28);
  }
  return;
}

Assistant:

void dual_dfs(std::vector<const Node *> &acc) const {
            if (visited) return;
            visited = true;
            for (auto i: dual_edges) {
                i->dual_dfs(acc);
            }
            acc.push_back(this);
        }